

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

int32_t __thiscall wasm::WasmBinaryWriter::writeU32LEBPlaceholder(WasmBinaryWriter *this)

{
  size_type sVar1;
  int32_t ret;
  WasmBinaryWriter *this_local;
  
  sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    (&this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>);
  BufferWithRandomAccess::operator<<(this->o,0);
  BufferWithRandomAccess::operator<<(this->o,'\0');
  return (int32_t)sVar1;
}

Assistant:

int32_t WasmBinaryWriter::writeU32LEBPlaceholder() {
  int32_t ret = o.size();
  o << int32_t(0);
  o << int8_t(0);
  return ret;
}